

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcppLibrary.hpp
# Opt level: O0

void __thiscall tcpp::StringInputStream::~StringInputStream(StringInputStream *this)

{
  StringInputStream *this_local;
  
  ~StringInputStream(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~StringInputStream() TCPP_NOEXCEPT = default;